

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[36],char_const*,char,char[17],char_const*>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [36],char **Args_1,
          char *Args_2,char (*Args_3) [17],char **Args_4)

{
  stringstream local_1c0 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [17];
  char *Args_local_2;
  char **Args_local_1;
  char (*Args_local) [36];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[36],char_const*,char,char[17],char_const*>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [36])this,(char **)Args,(char *)Args_1,(char (*) [17])Args_2,(char **)Args_3)
  ;
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}